

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::EmptyCharsetBitstateAssumptions(void)

{
  bool bVar1;
  long lVar2;
  StringPiece group [6];
  StringPiece local_228;
  StringPiece local_218 [6];
  LogMessage local_1b0;
  
  lVar2 = 8;
  do {
    *(undefined8 *)((long)local_218 + lVar2 + -8) = 0;
    *(undefined4 *)((long)&local_218[0].ptr_ + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  lVar2 = 0;
  do {
    RE2::RE2((RE2 *)&local_1b0,
             (char *)((long)&_ZZN3re231EmptyCharsetBitstateAssumptionsEvE11nop_empties_rel +
                     (long)*(int *)((long)&
                                          _ZZN3re231EmptyCharsetBitstateAssumptionsEvE11nop_empties_rel
                                   + lVar2)));
    local_228.ptr_ = "";
    local_228.length_ = 0;
    bVar1 = RE2::Match((RE2 *)&local_1b0,&local_228,0,0,UNANCHORED,local_218,6);
    RE2::~RE2((RE2 *)&local_1b0);
    if (!bVar1) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x20c,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,
                 "Check failed: RE2(nop_empties[i]).Match(\"\", 0, 0, RE2::UNANCHORED, group, 6)",
                 0x4c);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

TEST(EmptyCharset, BitstateAssumptions) {
  // Captures trigger use of Bitstate.
  static const char *nop_empties[] = {
    "((((()))))" "[^\\S\\s]?",
    "((((()))))" "([^\\S\\s])?",
    "((((()))))" "([^\\S\\s]|[^\\S\\s])?",
    "((((()))))" "(([^\\S\\s]|[^\\S\\s])|)"
  };
  StringPiece group[6];
  for (int i = 0; i < arraysize(nop_empties); i++)
    CHECK(RE2(nop_empties[i]).Match("", 0, 0, RE2::UNANCHORED, group, 6));
}